

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ExpressionResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  AssertionInfo *local_20;
  AssertionInfo *info_local;
  ExpressionResultBuilder *this_local;
  
  local_20 = info;
  info_local = (AssertionInfo *)this;
  this_local = (ExpressionResultBuilder *)__return_storage_ptr__;
  bVar1 = std::operator==(&(this->m_exprComponents).op,"");
  if (bVar1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+(__return_storage_ptr__,&(this->m_exprComponents).op,
                     &(this->m_exprComponents).lhs);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&local_20->capturedExpression);
    }
  }
  else {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"matches");
    if (bVar1) {
      std::operator+(&local_40,&(this->m_exprComponents).lhs," ");
      std::operator+(__return_storage_ptr__,&local_40,&(this->m_exprComponents).rhs);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      bVar1 = std::operator!=(&(this->m_exprComponents).op,"!");
      if (bVar1) {
        lVar2 = std::__cxx11::string::size();
        lVar3 = std::__cxx11::string::size();
        if ((ulong)(lVar2 + lVar3) < 0x1e) {
          std::operator+(&local_b0,&(this->m_exprComponents).lhs," ");
          std::operator+(&local_90,&local_b0,&(this->m_exprComponents).op);
          std::operator+(&local_70,&local_90," ");
          std::operator+(__return_storage_ptr__,&local_70,&(this->m_exprComponents).rhs);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          uVar4 = std::__cxx11::string::size();
          if ((uVar4 < 0x46) && (uVar4 = std::__cxx11::string::size(), uVar4 < 0x46)) {
            std::operator+(&local_130,"\n\t",&(this->m_exprComponents).lhs);
            std::operator+(&local_110,&local_130,"\n\t");
            std::operator+(&local_f0,&local_110,&(this->m_exprComponents).op);
            std::operator+(&local_d0,&local_f0,"\n\t");
            std::operator+(__return_storage_ptr__,&local_d0,&(this->m_exprComponents).rhs);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_130);
          }
          else {
            std::operator+(&local_1d0,"\n",&(this->m_exprComponents).lhs);
            std::operator+(&local_1b0,&local_1d0,"\n");
            std::operator+(&local_190,&local_1b0,&(this->m_exprComponents).op);
            std::operator+(&local_170,&local_190,"\n");
            std::operator+(&local_150,&local_170,&(this->m_exprComponents).rhs);
            std::operator+(__return_storage_ptr__,&local_150,"\n\n");
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1d0);
          }
        }
      }
      else {
        std::operator+(&local_2b0,"{can\'t expand - use ",&local_20->macroName);
        std::operator+(&local_290,&local_2b0,"_FALSE( ");
        std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_20->capturedExpression);
        std::operator+(&local_270,&local_290,&local_2d0);
        std::operator+(&local_250,&local_270," ) instead of ");
        std::operator+(&local_230,&local_250,&local_20->macroName);
        std::operator+(&local_210,&local_230,"( ");
        std::operator+(&local_1f0,&local_210,&local_20->capturedExpression);
        std::operator+(__return_storage_ptr__,&local_1f0," ) for better diagnostics}");
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionResultBuilder::reconstructExpression( const AssertionInfo& info ) const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? info.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 30 )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else if( m_exprComponents.lhs.size() < 70 && m_exprComponents.rhs.size() < 70 )
                return "\n\t" + m_exprComponents.lhs + "\n\t" + m_exprComponents.op + "\n\t" + m_exprComponents.rhs;
            else
                return "\n" + m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs + "\n\n";
        }
        else
            return "{can't expand - use " + info.macroName + "_FALSE( " + info.capturedExpression.substr(1) + " ) instead of " + info.macroName + "( " + info.capturedExpression + " ) for better diagnostics}";
    }